

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

void tokaddinc(tokcxdef *ctx,char *path,int pathlen)

{
  uchar *puVar1;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  bool bVar2;
  tokpdef *last;
  tokpdef *newpath;
  uint7 in_stack_ffffffffffffffd0;
  long *siz;
  errcxdef *in_stack_ffffffffffffffe0;
  
  siz = *(long **)(in_RDI + 0x20);
  while( true ) {
    bVar2 = false;
    if (siz != (long *)0x0) {
      bVar2 = *siz != 0;
    }
    if (!bVar2) break;
    siz = (long *)*siz;
  }
  puVar1 = mchalo(in_stack_ffffffffffffffe0,(size_t)siz,(char *)(ulong)in_stack_ffffffffffffffd0);
  *(int *)(puVar1 + 8) = in_EDX;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  memcpy(puVar1 + 0xc,in_RSI,(long)in_EDX);
  if (siz == (long *)0x0) {
    *(uchar **)(in_RDI + 0x20) = puVar1;
  }
  else {
    *siz = (long)puVar1;
  }
  return;
}

Assistant:

void tokaddinc(tokcxdef *ctx, char *path, int pathlen)
{
    tokpdef *newpath;
    tokpdef *last;
    
    /* find the tail of the include path list, if any */
    for (last = ctx->tokcxinc ; last && last->tokpnxt ;
         last = last->tokpnxt) ;
    
    /* allocate storage for and set up a new path structure */
    newpath = (tokpdef *)mchalo(ctx->tokcxerr,
                                (sizeof(tokpdef) + pathlen - 1),
                                "tokaddinc");
    newpath->tokplen = pathlen;
    newpath->tokpnxt = (tokpdef *)0;
    memcpy(newpath->tokpdir, path, (size_t)pathlen);
    
    /* link in at end of list (if no list yet, newpath becomes first entry) */
    if (last)
        last->tokpnxt = newpath;
    else
        ctx->tokcxinc = newpath;
}